

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86::destroy_pipeline(Convolution_x86 *this,Option *opt)

{
  Layer *pLVar1;
  Option opt_cpu;
  undefined4 local_38;
  int iStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  undefined4 uStack_24;
  uint uStack_20;
  int iStack_1c;
  undefined8 local_18;
  
  local_38 = *(undefined4 *)opt;
  iStack_34 = opt->num_threads;
  uStack_30 = *(undefined4 *)&opt->blob_allocator;
  uStack_2c = *(undefined4 *)((long)&opt->blob_allocator + 4);
  local_28 = *(undefined4 *)&opt->workspace_allocator;
  uStack_24 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
  iStack_1c = opt->use_winograd_convolution;
  local_18._0_4_ = opt->use_sgemm_convolution;
  local_18._4_4_ = opt->use_int8_inference;
  uStack_20 = *(uint *)&opt->vulkan_compute & 0xffffff00;
  pLVar1 = this->activation;
  if (pLVar1 != (Layer *)0x0) {
    (*pLVar1->_vptr_Layer[5])(pLVar1,&local_38);
    if (this->activation != (Layer *)0x0) {
      (*this->activation->_vptr_Layer[1])();
    }
    this->activation = (Layer *)0x0;
  }
  return 0;
}

Assistant:

int Convolution_x86::destroy_pipeline(const Option& opt)
{
    Option opt_cpu = opt;
    opt_cpu.vulkan_compute = false;

    if (activation)
    {
        activation->destroy_pipeline(opt_cpu);
        delete activation;
        activation = 0;
    }

    return 0;
}